

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

bool __thiscall smf::MidiFile::writeBase64(MidiFile *this,ostream *out,int width)

{
  ostream *poVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_t in_RCX;
  void *__buf;
  int local_210;
  int i;
  int length;
  undefined1 local_1e8 [8];
  string encoded;
  stringstream local_1b0 [7];
  bool status;
  stringstream raw;
  undefined1 local_1a0 [380];
  int local_24;
  ostream *poStack_20;
  int width_local;
  ostream *out_local;
  MidiFile *this_local;
  
  local_24 = width;
  poStack_20 = out;
  out_local = (ostream *)this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  uVar4 = write(this,(int)local_1a0,__buf,in_RCX);
  bVar2 = (byte)uVar4 & 1;
  this_local._7_1_ = bVar2;
  if ((uVar4 & 1) == 0) {
    encoded.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::stringstream::str();
    base64Encode((string *)local_1e8,this,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    if (local_24 < 1) {
      std::operator<<(poStack_20,(string *)local_1e8);
    }
    else {
      iVar3 = std::__cxx11::string::size();
      for (local_210 = 0; poVar1 = poStack_20, local_210 < iVar3; local_210 = local_210 + 1) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_1e8);
        std::operator<<(poVar1,*pcVar5);
        if ((local_210 + 1) % local_24 == 0) {
          std::operator<<(poStack_20,"\n");
        }
      }
      if ((iVar3 + 1) % local_24 != 0) {
        std::operator<<(poStack_20,"\n");
      }
    }
    encoded.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_1e8);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MidiFile::writeBase64(std::ostream& out, int width) {
	std::stringstream raw;
	bool status = MidiFile::write(raw);
	if (!status) {
		return status;
	}
	std::string encoded = MidiFile::base64Encode(raw.str());
	if (width <= 0) {
		out << encoded;
		return status;
	}
	int length = (int)encoded.size();
	for (int i=0; i<length; i++) {
		out << encoded[i];
		if ((i + 1) % width == 0) {
			out << "\n";
		}
	}
	if ((length + 1) % width != 0) {
		out << "\n";
	}
	return status;
}